

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_hsva_f(float h,float s,float v,float a)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int i;
  float f;
  float t;
  float q;
  float p;
  nk_colorf out;
  float a_local;
  float v_local;
  float s_local;
  float h_local;
  
  out.b = a;
  out.a = v;
  memset(&q,0,0x10);
  if (s <= 0.0) {
    q = out.a;
    p = out.a;
    out.r = out.a;
    s_local = (float)nk_rgb_f(out.a,out.a,out.a);
  }
  else {
    iVar1 = (int)(h / 0.16666667);
    fVar2 = h / 0.16666667 - (float)iVar1;
    fVar3 = out.a * (1.0 - s);
    fVar4 = out.a * (1.0 - s * fVar2);
    fVar2 = out.a * (1.0 - s * (1.0 - fVar2));
    q = fVar3;
    p = fVar3;
    out.r = fVar3;
    switch(iVar1) {
    case 0:
    default:
      q = out.a;
      p = fVar2;
      break;
    case 1:
      p = out.a;
      q = fVar4;
      break;
    case 2:
      p = out.a;
      out.r = fVar2;
      break;
    case 3:
      out.r = out.a;
      p = fVar4;
      break;
    case 4:
      out.r = out.a;
      q = fVar2;
      break;
    case 5:
      q = out.a;
      out.r = fVar4;
    }
    s_local = (float)nk_rgba_f(q,p,out.r,out.b);
  }
  return (nk_color)s_local;
}

Assistant:

NK_API struct nk_color
nk_hsva_f(float h, float s, float v, float a)
{
    struct nk_colorf out = {0,0,0,0};
    float p, q, t, f;
    int i;

    if (s <= 0.0f) {
        out.r = v; out.g = v; out.b = v;
        return nk_rgb_f(out.r, out.g, out.b);
    }

    h = h / (60.0f/360.0f);
    i = (int)h;
    f = h - (float)i;
    p = v * (1.0f - s);
    q = v * (1.0f - (s * f));
    t = v * (1.0f - s * (1.0f - f));

    switch (i) {
    case 0: default: out.r = v; out.g = t; out.b = p; break;
    case 1: out.r = q; out.g = v; out.b = p; break;
    case 2: out.r = p; out.g = v; out.b = t; break;
    case 3: out.r = p; out.g = q; out.b = v; break;
    case 4: out.r = t; out.g = p; out.b = v; break;
    case 5: out.r = v; out.g = p; out.b = q; break;
    }
    return nk_rgba_f(out.r, out.g, out.b, a);
}